

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physical_arrow_batch_collector.cpp
# Opt level: O0

SinkFinalizeType __thiscall
duckdb::PhysicalArrowBatchCollector::Finalize
          (PhysicalArrowBatchCollector *this,Pipeline *pipeline,Event *event,ClientContext *context,
          OperatorSinkFinalizeInput *input)

{
  idx_t iVar1;
  shared_ptr<duckdb::Event,_true> *replacement_event;
  BatchedDataCollection *args_1;
  ArrowQueryResult *args;
  QueryResult *this_00;
  ClientContext *in_RSI;
  long in_RDI;
  unique_ptr<duckdb::ArrowQueryResult,_std::default_delete<duckdb::ArrowQueryResult>_> *puVar2;
  shared_ptr<duckdb::ArrowMergeEvent,_true> *ref;
  unsigned_long *in_R8;
  shared_ptr<duckdb::ArrowMergeEvent,_true> new_event;
  ArrowQueryResult *arrow_result;
  idx_t total_tuple_count;
  ArrowBatchGlobalState *gstate;
  GlobalSinkState *in_stack_fffffffffffffe80;
  BatchedDataCollection *in_stack_fffffffffffffea0;
  Pipeline *in_stack_fffffffffffffea8;
  Event *this_01;
  ClientProperties *in_stack_ffffffffffffff98;
  vector<duckdb::LogicalType,_true> *in_stack_ffffffffffffffa0;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
  *in_stack_ffffffffffffffa8;
  StatementProperties *in_stack_ffffffffffffffb0;
  StatementType *in_stack_ffffffffffffffb8;
  
  GlobalSinkState::Cast<duckdb::ArrowBatchGlobalState>(in_stack_fffffffffffffe80);
  iVar1 = BatchedDataCollection::Count(in_stack_fffffffffffffea0);
  if (iVar1 == 0) {
    ClientContext::GetClientProperties(in_RSI);
    puVar2 = (unique_ptr<duckdb::ArrowQueryResult,_std::default_delete<duckdb::ArrowQueryResult>_> *
             )(in_RDI + 0x130);
    make_uniq<duckdb::ArrowQueryResult,duckdb::StatementType_const&,duckdb::StatementProperties_const&,duckdb::vector<std::__cxx11::string,true>const&,duckdb::vector<duckdb::LogicalType,true>const&,duckdb::ClientProperties,unsigned_long_const&>
              (in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8,
               in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98,in_R8);
    unique_ptr<duckdb::QueryResult,std::default_delete<duckdb::QueryResult>,true>::
    unique_ptr<duckdb::ArrowQueryResult,std::default_delete<std::unique_ptr<duckdb::QueryResult,std::default_delete<duckdb::QueryResult>>>,void>
              ((unique_ptr<duckdb::QueryResult,_std::default_delete<duckdb::QueryResult>,_true> *)
               in_stack_fffffffffffffe80,puVar2);
    unique_ptr<duckdb::QueryResult,_std::default_delete<duckdb::QueryResult>,_true>::operator=
              ((unique_ptr<duckdb::QueryResult,_std::default_delete<duckdb::QueryResult>,_true> *)
               in_stack_fffffffffffffe80,
               (unique_ptr<duckdb::QueryResult,_std::default_delete<duckdb::QueryResult>,_true> *)
               puVar2);
    unique_ptr<duckdb::QueryResult,_std::default_delete<duckdb::QueryResult>,_true>::~unique_ptr
              ((unique_ptr<duckdb::QueryResult,_std::default_delete<duckdb::QueryResult>,_true> *)
               0x152a6c8);
    unique_ptr<duckdb::ArrowQueryResult,_std::default_delete<duckdb::ArrowQueryResult>,_true>::
    ~unique_ptr((unique_ptr<duckdb::ArrowQueryResult,_std::default_delete<duckdb::ArrowQueryResult>,_true>
                 *)0x152a6d5);
    ClientProperties::~ClientProperties((ClientProperties *)0x152a6e2);
  }
  else {
    args_1 = (BatchedDataCollection *)(in_RDI + 0x80);
    args = (ArrowQueryResult *)(in_RDI + 0x88);
    this_00 = (QueryResult *)(in_RDI + 0x118);
    replacement_event = (shared_ptr<duckdb::Event,_true> *)(in_RDI + 0x28);
    this_01 = (Event *)&stack0xffffffffffffff30;
    ClientContext::GetClientProperties(in_RSI);
    ref = (shared_ptr<duckdb::ArrowMergeEvent,_true> *)(in_RDI + 0x130);
    make_uniq<duckdb::ArrowQueryResult,duckdb::StatementType_const&,duckdb::StatementProperties_const&,duckdb::vector<std::__cxx11::string,true>const&,duckdb::vector<duckdb::LogicalType,true>const&,duckdb::ClientProperties,unsigned_long_const&>
              (in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8,
               in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98,in_R8);
    unique_ptr<duckdb::QueryResult,std::default_delete<duckdb::QueryResult>,true>::
    unique_ptr<duckdb::ArrowQueryResult,std::default_delete<std::unique_ptr<duckdb::QueryResult,std::default_delete<duckdb::QueryResult>>>,void>
              ((unique_ptr<duckdb::QueryResult,_std::default_delete<duckdb::QueryResult>,_true> *)
               in_stack_fffffffffffffe80,
               (unique_ptr<duckdb::ArrowQueryResult,_std::default_delete<duckdb::ArrowQueryResult>_>
                *)ref);
    unique_ptr<duckdb::QueryResult,_std::default_delete<duckdb::QueryResult>,_true>::operator=
              ((unique_ptr<duckdb::QueryResult,_std::default_delete<duckdb::QueryResult>,_true> *)
               in_stack_fffffffffffffe80,
               (unique_ptr<duckdb::QueryResult,_std::default_delete<duckdb::QueryResult>,_true> *)
               ref);
    unique_ptr<duckdb::QueryResult,_std::default_delete<duckdb::QueryResult>,_true>::~unique_ptr
              ((unique_ptr<duckdb::QueryResult,_std::default_delete<duckdb::QueryResult>,_true> *)
               0x152a7e9);
    unique_ptr<duckdb::ArrowQueryResult,_std::default_delete<duckdb::ArrowQueryResult>,_true>::
    ~unique_ptr((unique_ptr<duckdb::ArrowQueryResult,_std::default_delete<duckdb::ArrowQueryResult>,_true>
                 *)0x152a7f3);
    ClientProperties::~ClientProperties((ClientProperties *)0x152a800);
    unique_ptr<duckdb::QueryResult,_std::default_delete<duckdb::QueryResult>,_true>::operator->
              ((unique_ptr<duckdb::QueryResult,_std::default_delete<duckdb::QueryResult>,_true> *)
               in_stack_fffffffffffffe80);
    QueryResult::Cast<duckdb::ArrowQueryResult>(this_00);
    make_shared_ptr<duckdb::ArrowMergeEvent,duckdb::ArrowQueryResult&,duckdb::BatchedDataCollection&,duckdb::Pipeline&>
              (args,args_1,in_stack_fffffffffffffea8);
    shared_ptr<duckdb::Event,_true>::shared_ptr<duckdb::ArrowMergeEvent,_0>
              ((shared_ptr<duckdb::Event,_true> *)in_stack_fffffffffffffe80,ref);
    Event::InsertEvent(this_01,replacement_event);
    shared_ptr<duckdb::Event,_true>::~shared_ptr((shared_ptr<duckdb::Event,_true> *)0x152a894);
    shared_ptr<duckdb::ArrowMergeEvent,_true>::~shared_ptr
              ((shared_ptr<duckdb::ArrowMergeEvent,_true> *)0x152a8a9);
  }
  return READY;
}

Assistant:

SinkFinalizeType PhysicalArrowBatchCollector::Finalize(Pipeline &pipeline, Event &event, ClientContext &context,
                                                       OperatorSinkFinalizeInput &input) const {
	auto &gstate = input.global_state.Cast<ArrowBatchGlobalState>();

	auto total_tuple_count = gstate.data.Count();
	if (total_tuple_count == 0) {
		// Create the result containing a single empty result conversion
		gstate.result = make_uniq<ArrowQueryResult>(statement_type, properties, names, types,
		                                            context.GetClientProperties(), record_batch_size);
		return SinkFinalizeType::READY;
	}

	// Already create the final query result
	gstate.result = make_uniq<ArrowQueryResult>(statement_type, properties, names, types, context.GetClientProperties(),
	                                            record_batch_size);
	// Spawn an event that will populate the conversion result
	auto &arrow_result = gstate.result->Cast<ArrowQueryResult>();
	auto new_event = make_shared_ptr<ArrowMergeEvent>(arrow_result, gstate.data, pipeline);
	event.InsertEvent(std::move(new_event));

	return SinkFinalizeType::READY;
}